

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3DbSpanDup(sqlite3 *db,char *zStart,char *zEnd)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  int iVar4;
  long lVar5;
  char *z;
  
  z = zStart + -1;
  pcVar2 = zStart + -2;
  iVar4 = ((int)zEnd - (int)zStart) + 1;
  do {
    pbVar3 = (byte *)(z + 1);
    z = z + 1;
    pcVar2 = pcVar2 + 1;
    iVar4 = iVar4 + -1;
  } while ((""[*pbVar3] & 1) != 0);
  pbVar3 = (byte *)(pcVar2 + iVar4);
  lVar5 = ((long)iVar4 << 0x20) + 0x100000000;
  do {
    lVar5 = lVar5 + -0x100000000;
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + -1;
  } while ((""[bVar1] & 1) != 0);
  pcVar2 = sqlite3DbStrNDup(db,z,lVar5 >> 0x20);
  return pcVar2;
}

Assistant:

SQLITE_PRIVATE char *sqlite3DbSpanDup(sqlite3 *db, const char *zStart, const char *zEnd){
  int n;
#ifdef SQLITE_DEBUG
  /* Because of the way the parser works, the span is guaranteed to contain
  ** at least one non-space character */
  for(n=0; sqlite3Isspace(zStart[n]); n++){ assert( &zStart[n]<zEnd ); }
#endif
  while( sqlite3Isspace(zStart[0]) ) zStart++;
  n = (int)(zEnd - zStart);
  while( sqlite3Isspace(zStart[n-1]) ) n--;
  return sqlite3DbStrNDup(db, zStart, n);
}